

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_stream_data * JX9StreamDataInit(jx9_vm *pVm,int iType)

{
  ProcConsumer p_Var1;
  void *pvVar2;
  jx9_stream_data *pjVar3;
  ulong uVar4;
  void *pvVar5;
  
  if (pVm == (jx9_vm *)0x0) {
    return (jx9_stream_data *)0x0;
  }
  pjVar3 = (jx9_stream_data *)SyMemBackendAlloc(&pVm->sAllocator,0x30);
  if (pjVar3 == (jx9_stream_data *)0x0) {
    return (jx9_stream_data *)0x0;
  }
  uVar4 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&pjVar3->pVm + uVar4 + 4) = 0;
    uVar4 = uVar4 + 4;
  } while (uVar4 < 0x2c);
  pjVar3->iType = iType;
  if (iType == 2) {
    pvVar5 = (void *)0x1;
  }
  else if (iType == 3) {
    pvVar5 = (void *)0x2;
  }
  else {
    if (iType == 4) {
      p_Var1 = (pVm->sVmConsumer).xConsumer;
      pvVar5 = (pVm->sVmConsumer).pUserData;
      pvVar2 = (pVm->sVmConsumer).pDefData;
      (pjVar3->x).sConsumer.xDef = (pVm->sVmConsumer).xDef;
      (pjVar3->x).sConsumer.pDefData = pvVar2;
      (pjVar3->x).pHandle = p_Var1;
      (pjVar3->x).sConsumer.pUserData = pvVar5;
      goto LAB_0012f783;
    }
    pvVar5 = (void *)0x0;
  }
  (pjVar3->x).pHandle = pvVar5;
LAB_0012f783:
  pjVar3->pVm = pVm;
  return pjVar3;
}

Assistant:

static jx9_stream_data * JX9StreamDataInit(jx9_vm *pVm, int iType)
{
	jx9_stream_data *pData;
	if( pVm == 0 ){
		return 0;
	}
	/* Allocate a new instance */
	pData = (jx9_stream_data *)SyMemBackendAlloc(&pVm->sAllocator, sizeof(jx9_stream_data));
	if( pData == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pData, sizeof(jx9_stream_data));
	/* Initialize fields */
	pData->iType = iType;
	if( iType == JX9_IO_STREAM_OUTPUT ){
		/* Point to the default VM consumer routine. */
		pData->x.sConsumer = pVm->sVmConsumer; 
	}else{
#ifdef __WINNT__
		DWORD nChannel;
		switch(iType){
		case JX9_IO_STREAM_STDOUT:	nChannel = STD_OUTPUT_HANDLE; break;
		case JX9_IO_STREAM_STDERR:  nChannel = STD_ERROR_HANDLE; break;
		default:
			nChannel = STD_INPUT_HANDLE; 
			break;
		}
		pData->x.pHandle = GetStdHandle(nChannel);
#else
		/* Assume an UNIX system */
		int ifd = STDIN_FILENO;
		switch(iType){
		case JX9_IO_STREAM_STDOUT:  ifd = STDOUT_FILENO; break;
		case JX9_IO_STREAM_STDERR:  ifd = STDERR_FILENO; break;
		default:
			break;
		}
		pData->x.pHandle = SX_INT_TO_PTR(ifd);
#endif
	}
	pData->pVm = pVm;
	return pData;
}